

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_aco.cpp
# Opt level: O0

void aco_destroy(aco_t *co)

{
  aco_t *co_local;
  
  if (co == (aco_t *)0x0) {
    abort();
  }
  if (co->main_co != (aco_t *)0x0) {
    if (co->share_stack->owner == co) {
      co->share_stack->owner = (aco_t *)0x0;
      co->share_stack->align_validsz = 0;
    }
    free((co->save_stack).ptr);
    (co->save_stack).ptr = (void *)0x0;
  }
  free(co);
  return;
}

Assistant:

void aco_destroy(aco_t* co){
    assertptr(co);
    if (!aco_is_main_co(co)) {
        if(co->share_stack->owner == co){
            co->share_stack->owner = nullptr;
            co->share_stack->align_validsz = 0;
        }
        eco_free(co->save_stack.ptr);
        co->save_stack.ptr = nullptr;
    }
    eco_free(co);
}